

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixSetSystemCall(sqlite3_vfs *pNotUsed,char *zName,sqlite3_syscall_ptr pNewFunc)

{
  int iVar1;
  sqlite3_syscall_ptr in_RDX;
  char *in_RSI;
  int rc;
  uint i;
  int local_20;
  uint local_1c;
  sqlite3_syscall_ptr local_18;
  
  local_20 = 0xc;
  if (in_RSI == (char *)0x0) {
    local_20 = 0;
    for (local_1c = 0; local_1c < 0x1d; local_1c = local_1c + 1) {
      if (aSyscall[local_1c].pDefault != (sqlite3_syscall_ptr)0x0) {
        aSyscall[local_1c].pCurrent = aSyscall[local_1c].pDefault;
      }
    }
  }
  else {
    for (local_1c = 0; local_1c < 0x1d; local_1c = local_1c + 1) {
      iVar1 = strcmp(in_RSI,aSyscall[local_1c].zName);
      if (iVar1 == 0) {
        if (aSyscall[local_1c].pDefault == (sqlite3_syscall_ptr)0x0) {
          aSyscall[local_1c].pDefault = aSyscall[local_1c].pCurrent;
        }
        local_18 = in_RDX;
        if (in_RDX == (sqlite3_syscall_ptr)0x0) {
          local_18 = aSyscall[local_1c].pDefault;
        }
        aSyscall[local_1c].pCurrent = local_18;
        return 0;
      }
    }
  }
  return local_20;
}

Assistant:

static int unixSetSystemCall(
  sqlite3_vfs *pNotUsed,        /* The VFS pointer.  Not used */
  const char *zName,            /* Name of system call to override */
  sqlite3_syscall_ptr pNewFunc  /* Pointer to new system call value */
){
  unsigned int i;
  int rc = SQLITE_NOTFOUND;

  UNUSED_PARAMETER(pNotUsed);
  if( zName==0 ){
    /* If no zName is given, restore all system calls to their default
    ** settings and return NULL
    */
    rc = SQLITE_OK;
    for(i=0; i<sizeof(aSyscall)/sizeof(aSyscall[0]); i++){
      if( aSyscall[i].pDefault ){
        aSyscall[i].pCurrent = aSyscall[i].pDefault;
      }
    }
  }else{
    /* If zName is specified, operate on only the one system call
    ** specified.
    */
    for(i=0; i<sizeof(aSyscall)/sizeof(aSyscall[0]); i++){
      if( strcmp(zName, aSyscall[i].zName)==0 ){
        if( aSyscall[i].pDefault==0 ){
          aSyscall[i].pDefault = aSyscall[i].pCurrent;
        }
        rc = SQLITE_OK;
        if( pNewFunc==0 ) pNewFunc = aSyscall[i].pDefault;
        aSyscall[i].pCurrent = pNewFunc;
        break;
      }
    }
  }
  return rc;
}